

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O0

void __thiscall unit_test::delayed_with_response(unit_test *this)

{
  binder *in_RDI;
  ptime pVar1;
  shared_ptr<cppcms::http::context> *in_stack_ffffffffffffff58;
  shared_ptr<cppcms::http::context> *this_00;
  unit_test *p;
  binder *func;
  callback<void_(const_std::error_code_&)> *in_stack_ffffffffffffffa0;
  shared_ptr<cppcms::http::context> local_18;
  
  this_00 = &local_18;
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::operator=(this_00,in_stack_ffffffffffffff58);
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x10b98b)
  ;
  p = (unit_test *)&in_RDI[1].field_0x10;
  pVar1 = booster::ptime::milliseconds((longlong)this_00);
  pVar1._8_8_ = pVar1.sec;
  pVar1.sec = (longlong)p;
  booster::aio::deadline_timer::expires_from_now(pVar1);
  booster::intrusive_ptr<unit_test>::intrusive_ptr(&in_RDI->self,p,SUB81((ulong)this_00 >> 0x38,0));
  func = (binder *)0x0;
  binder::binder(in_RDI,(intrusive_ptr<unit_test> *)p,(member_type)in_stack_ffffffffffffff58);
  booster::callback<void_(const_std::error_code_&)>::callback<unit_test::binder>
            (in_stack_ffffffffffffffa0,func);
  booster::aio::deadline_timer::async_wait((callback *)p);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x10ba52);
  binder::~binder((binder *)0x10ba5c);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr((intrusive_ptr<unit_test> *)this_00);
  return;
}

Assistant:

void delayed_with_response()
	{
		context_ = release_context();
		timer_.expires_from_now(booster::ptime::milliseconds(300));
		timer_.async_wait(binder(this,&unit_test::handle2));
	}